

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O3

void __thiscall
webfront::msg::FunctionCall::
encodeParameter<char_const(&)[12],webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>>
          (FunctionCall *this,char (*t) [12],Frame<webfront::networking::TCPNetworkingTS> *frame)

{
  uint8_t *puVar1;
  uint32_t *puVar2;
  size_t sVar3;
  ostream *poVar4;
  size_t sVar5;
  span<const_std::byte,_18446744073709551615UL> buffer;
  span<const_std::byte,_18446744073709551615UL> buffer_00;
  
  puVar1 = &(this->head).parametersCount;
  *puVar1 = *puVar1 + '\x01';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Param: ",7);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,") [T = const char (&)[12]]",0x19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,") [T = char[12]]",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
  sVar5 = strlen(*t);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,*t,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  buffer._M_ptr = (this->buffer)._M_elems + this->encodeBufferIndex;
  buffer._M_extent._M_extent_value = 2;
  websocket::Frame<webfront::networking::TCPNetworkingTS>::addBuffer(frame,buffer);
  sVar3 = this->encodeBufferIndex;
  this->encodeBufferIndex = sVar3 + 1;
  (this->buffer)._M_elems[sVar3] = 4;
  (this->buffer)._M_elems[this->encodeBufferIndex] = 0xb;
  this->encodeBufferIndex = this->encodeBufferIndex + 1;
  puVar2 = &(this->head).parametersDataSize;
  *puVar2 = *puVar2 + 2;
  buffer_00._M_extent._M_extent_value = 0xb;
  buffer_00._M_ptr = (pointer)t;
  websocket::Frame<webfront::networking::TCPNetworkingTS>::addBuffer(frame,buffer_00);
  puVar2 = &(this->head).parametersDataSize;
  *puVar2 = *puVar2 + 0xb;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-> encoded to string of size ",0x1d);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," in a span.\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bufferIndex = ",0xe);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ,payloadSize = ",0x10);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  return;
}

Assistant:

void encodeParameter(T&& t, WebSocketFrame& frame) {
        using namespace std;
        using ParamType = remove_cvref_t<T>;
        setParametersCount(getParametersCount() + 1);

        if constexpr (is_printable<T>::value) {
            std::cout << "Param: " << typeName<T>() << " -> " << typeName<ParamType>() << " : " << t << "\n";
        }

        [[maybe_unused]] auto encodeType = [&, this](msg::CodedType type, auto size, WebSocketFrame& wsFrame) {
            wsFrame.addBuffer(std::span(&buffer[encodeBufferIndex], 1 + sizeof(size)));
            buffer[encodeBufferIndex++] = static_cast<std::byte>(type);
            std::copy_n(reinterpret_cast<const std::byte*>(&size), sizeof(size), &buffer[encodeBufferIndex]);
            encodeBufferIndex += sizeof(size);
            incrementPayloadSize(1 + sizeof(size));
        };

        [[maybe_unused]] auto encodeString = [&](const char* str, size_t size) constexpr {
            if (size < 256)
                encodeType(msg::CodedType::smallString, static_cast<uint8_t>(size), frame);
            else
                encodeType(msg::CodedType::string, static_cast<uint16_t>(size), frame);
            frame.addBuffer(span(reinterpret_cast<const std::byte*>(str), size));
            incrementPayloadSize(size);

            std::cout << "-> encoded to string of size " << size << " in a span.\n";
        };

        if constexpr (is_tuple_v<ParamType>) {
            uint8_t nbParams = static_cast<uint8_t>(tuple_size<ParamType>::value);
            encodeType(msg::CodedType::tuple, nbParams, frame);
            std::apply([&](auto&... tupleArgs) { ((encodeParameter(tupleArgs, frame)), ...); }, t);
        }
        else if constexpr (is_same_v<ParamType, bool>) {
            frame.addBuffer(span(&buffer[encodeBufferIndex], 1));
            buffer[encodeBufferIndex++] = static_cast<byte>(t ? msg::CodedType::booleanTrue : msg::CodedType::booleanFalse);
            incrementPayloadSize(1);
            std::cout << "-> encoded to bool of size " << 1 << " in a span.";
        }
        else if constexpr (is_arithmetic_v<ParamType>) {
            double number = t;
            frame.addBuffer(span(&buffer[encodeBufferIndex], 1 + sizeof(number)));
            buffer[encodeBufferIndex++] = static_cast<byte>(msg::CodedType::number);
            copy_n(reinterpret_cast<const byte*>(&number), sizeof(number), &buffer[encodeBufferIndex]);
            encodeBufferIndex += sizeof(number);
            incrementPayloadSize(1 + sizeof(number));
            std::cout << "-> encoded to number of size " << sizeof(number) << " in a span.";
        }

        else if constexpr (is_array_v<ParamType>) {
            using ElementType = remove_all_extents_t<ParamType>;
            //   cout << "Array of " << typeName<ElementType>() << "\n";
            //   cout << typeName<ParamType>() << " is bounded : " << is_bounded_array_v<ParamType> << "\n";
            if constexpr (is_same_v<ElementType, char>) {
                if constexpr (is_bounded_array_v<ParamType>)
                    encodeString(t, extent_v<ParamType> - 1);
                else
                    encodeString(t, char_traits<char>::length(t));
            }
            else
                static_assert(is_same_v<ElementType, char>, "Arrays are not supported by JSFunction");
        }
        else if constexpr (is_same_v<ParamType, const char*>)
            encodeString(t, char_traits<char>::length(t));

        else if constexpr (is_same_v<ParamType, string> or is_same_v<ParamType, string_view>)
            encodeString(t.data(), t.size());

        else if constexpr (is_pointer_v<ParamType>)
            static_assert(!is_pointer_v<ParamType>, "Pointers cannot be used by JSFunction");

        else if constexpr (is_base_of_v<std::exception, ParamType>) {
            std::cout << "Exception : " << t.what() << '\n';
            auto textSize = char_traits<char>::length(t.what());
            encodeType(msg::CodedType::exception, static_cast<uint16_t>(textSize), frame);
            frame.addBuffer(span(reinterpret_cast<const std::byte*>(t.what()), textSize));
            incrementPayloadSize(textSize);
        }

        std::cout << "bufferIndex = " << encodeBufferIndex << " ,payloadSize = " << getPayloadSize() << "\n";
    }